

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_aead80pq.c
# Opt level: O0

size_t ascon_aead80pq_decrypt_final
                 (ascon_aead_ctx_t *ctx,uint8_t *plaintext,_Bool *is_tag_valid,uint8_t *expected_tag
                 ,size_t expected_tag_len)

{
  byte bVar1;
  _Bool _Var2;
  uint64_t uVar3;
  uint64_t uVar4;
  undefined8 in_RDX;
  uint8_t *in_RSI;
  ascon_aead_ctx_t *in_RDI;
  uint64_t c_0;
  size_t freshly_generated_plaintext_len;
  
  if ((in_RDI->bufstate).flow_state != '\x06') {
    ascon_aead128_80pq_finalise_assoc_data((ascon_aead_ctx_t *)0x128c85);
  }
  uVar3 = bigendian_decode_varlen((in_RDI->bufstate).buffer,(in_RDI->bufstate).buffer_len);
  bigendian_encode_varlen(in_RSI,(in_RDI->bufstate).sponge.x0 ^ uVar3,(in_RDI->bufstate).buffer_len)
  ;
  uVar4 = mask_most_signif_bytes((in_RDI->bufstate).buffer_len);
  (in_RDI->bufstate).sponge.x0 = (uVar4 ^ 0xffffffffffffffff) & (in_RDI->bufstate).sponge.x0;
  (in_RDI->bufstate).sponge.x0 = uVar3 | (in_RDI->bufstate).sponge.x0;
  (in_RDI->bufstate).sponge.x0 =
       0x80L << ((in_RDI->bufstate).buffer_len * -8 + 0x38 & 0x3f) ^ (in_RDI->bufstate).sponge.x0;
  bVar1 = (in_RDI->bufstate).buffer_len;
  (in_RDI->bufstate).sponge.x1 =
       (in_RDI->k0 << 0x20 | in_RDI->k1 >> 0x20) ^ (in_RDI->bufstate).sponge.x1;
  (in_RDI->bufstate).sponge.x2 =
       (in_RDI->k1 << 0x20 | in_RDI->k2 >> 0x20) ^ (in_RDI->bufstate).sponge.x2;
  (in_RDI->bufstate).sponge.x3 = in_RDI->k2 << 0x20 ^ (in_RDI->bufstate).sponge.x3;
  ascon_permutation_12((ascon_sponge_t *)0x128daf);
  (in_RDI->bufstate).sponge.x3 = in_RDI->k1 ^ (in_RDI->bufstate).sponge.x3;
  (in_RDI->bufstate).sponge.x4 = in_RDI->k2 ^ (in_RDI->bufstate).sponge.x4;
  _Var2 = ascon_aead_is_tag_valid((ascon_aead_ctx_t *)c_0,(uint8_t *)in_RDI,(size_t)in_RSI);
  *(_Bool *)in_RDX = _Var2;
  ascon_aead_cleanup(in_RDI);
  return (ulong)bVar1;
}

Assistant:

ASCON_API size_t
ascon_aead80pq_decrypt_final(ascon_aead_ctx_t* const ctx,
                             uint8_t* plaintext,
                             bool* const is_tag_valid,
                             const uint8_t* const expected_tag,
                             const size_t expected_tag_len)
{
    ASCON_ASSERT(ctx != NULL);
    ASCON_ASSERT(plaintext != NULL);
    ASCON_ASSERT(expected_tag_len == 0 || expected_tag != NULL);
    ASCON_ASSERT(is_tag_valid != NULL);
    if (ctx->bufstate.flow_state != ASCON_FLOW_AEAD128_80pq_DECRYPT_UPDATED)
    {
        // Finalise the associated data if not already done sos.
        ascon_aead128_80pq_finalise_assoc_data(ctx);
    }
    size_t freshly_generated_plaintext_len = 0;
    // If there is any remaining less-than-a-block ciphertext to be absorbed
    // cached in the buffer, pad it and absorb it.
    // Absorb ciphertext in buffer
    const uint64_t c_0 = bigendian_decode_varlen(ctx->bufstate.buffer,
                                                 ctx->bufstate.buffer_len);
    // Squeeze out last plaintext bytes
    bigendian_encode_varlen(plaintext, ctx->bufstate.sponge.x0 ^ c_0,
                            ctx->bufstate.buffer_len);
    // Final state changes at decryption's end
    ctx->bufstate.sponge.x0 &= ~mask_most_signif_bytes(ctx->bufstate.buffer_len);
    ctx->bufstate.sponge.x0 |= c_0;
    ctx->bufstate.sponge.x0 ^= PADDING(ctx->bufstate.buffer_len);
    freshly_generated_plaintext_len += ctx->bufstate.buffer_len;
    // End of decryption, start of tag validation.
    // Apply key twice more with a permutation to set the state for the tag.
    ctx->bufstate.sponge.x1 ^= ctx->k0 << 32U | ctx->k1 >> 32U;
    ctx->bufstate.sponge.x2 ^= ctx->k1 << 32U | ctx->k2 >> 32U;
    ctx->bufstate.sponge.x3 ^= ctx->k2 << 32U;
    ascon_permutation_12(&ctx->bufstate.sponge);
    ctx->bufstate.sponge.x3 ^= ctx->k1;
    ctx->bufstate.sponge.x4 ^= ctx->k2;
    // Validate tag with variable len
    *is_tag_valid = ascon_aead_is_tag_valid(ctx, expected_tag, expected_tag_len);
    // Final security cleanup of the internal state and key.
    ascon_aead_cleanup(ctx);
    return freshly_generated_plaintext_len;
}